

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O0

Result wallet::feebumper::CommitTransaction
                 (CWallet *wallet,uint256 *txid,CMutableTransaction *mtx,
                 vector<bilingual_str,_std::allocator<bilingual_str>_> *errors,uint256 *bumped_txid)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint256 *__s;
  allocator<char> *__a;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_RCX;
  undefined8 in_RDX;
  CWalletTx *in_RSI;
  CWallet *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  Result result;
  CWalletTx *oldWtx;
  CTransactionRef tx;
  iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  mapValue_t mapValue;
  CWalletTx *in_stack_fffffffffffffd38;
  CMutableTransaction *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  key_type *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  char *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  CWalletTx *newHash;
  uint256 *in_stack_fffffffffffffde8;
  CWallet *in_stack_fffffffffffffdf0;
  undefined1 require_mine;
  Result local_1d8;
  allocator<char> local_1d1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe30;
  mapValue_t *in_stack_fffffffffffffe38;
  CTransactionRef *in_stack_fffffffffffffe40;
  CWallet *in_stack_fffffffffffffe48;
  allocator<char> local_1a1 [24];
  allocator<char> local_189;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_188;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [5];
  long local_8;
  
  require_mine = (undefined1)((ulong)in_RDX >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd78,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68,
             (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  bVar4 = std::vector<bilingual_str,_std::allocator<bilingual_str>_>::empty
                    ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  if (bVar4) {
    bVar4 = base_blob<256U>::IsNull
                      ((base_blob<256U> *)
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    if (bVar4) {
      local_180._M_cur =
           (__node_type *)
           std::
           unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                  *)in_stack_fffffffffffffd40);
    }
    else {
      local_180._M_cur =
           (__node_type *)
           std::
           unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                   *)in_stack_fffffffffffffd40,(key_type *)in_stack_fffffffffffffd38);
    }
    local_188._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                *)in_stack_fffffffffffffd40);
    bVar4 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_fffffffffffffd40);
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      Untranslated(in_stack_fffffffffffffd70);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffd38,
                 (value_type *)0x17bc57b);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(&local_189);
      local_1d8 = MISC_ERROR;
    }
    else {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                         ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                           *)in_stack_fffffffffffffd38);
      newHash = &ppVar5->second;
      local_1d8 = PreconditionChecks(in_RDI,in_RSI,(bool)require_mine,in_RCX);
      if (local_1d8 == OK) {
        ::MakeTransactionRef<CMutableTransaction>(in_stack_fffffffffffffd40);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&in_stack_fffffffffffffd38->mapValue,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x17bc6f7);
        CWalletTx::GetHash(in_stack_fffffffffffffd38);
        transaction_identifier<false>::ToString_abi_cxx11_
                  ((transaction_identifier<false> *)in_stack_fffffffffffffd40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
        pbVar6 = local_b8;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffd98,pbVar6);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd38);
        std::allocator<char>::~allocator(local_1a1);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd38);
        std::shared_ptr<const_CTransaction>::shared_ptr
                  ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd38,
                   (shared_ptr<const_CTransaction> *)0x17bc7c7);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&in_stack_fffffffffffffd38->mapValue,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x17bc7dc);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pbVar6,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd88);
        CWallet::CommitTransaction
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   in_stack_fffffffffffffe30);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map(&in_stack_fffffffffffffd38->mapValue);
        std::shared_ptr<const_CTransaction>::~shared_ptr
                  ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd38);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffd38);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffd38);
        __s = transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<false> *)in_stack_fffffffffffffd38);
        uVar1 = *(undefined8 *)(__s->super_base_blob<256U>).m_data._M_elems;
        uVar2 = *(undefined8 *)((__s->super_base_blob<256U>).m_data._M_elems + 8);
        uVar3 = *(undefined8 *)((__s->super_base_blob<256U>).m_data._M_elems + 0x18);
        in_R8[2] = *(undefined8 *)((__s->super_base_blob<256U>).m_data._M_elems + 0x10);
        in_R8[3] = uVar3;
        *in_R8 = uVar1;
        in_R8[1] = uVar2;
        __a = (allocator<char> *)CWalletTx::GetHash(in_stack_fffffffffffffd38);
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)in_stack_fffffffffffffd38);
        bVar4 = CWallet::MarkReplaced
                          (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(uint256 *)newHash);
        if (!bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(pbVar6,(char *)__s,__a);
          Untranslated((string *)in_RDI);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                    ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                     in_stack_fffffffffffffd38,(value_type *)0x17bc94a);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd38);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd38);
          std::allocator<char>::~allocator(&local_1d1);
        }
        local_1d8 = OK;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map(&in_stack_fffffffffffffd38->mapValue);
        std::shared_ptr<const_CTransaction>::~shared_ptr
                  ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffd38);
      }
    }
  }
  else {
    local_1d8 = MISC_ERROR;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1d8;
}

Assistant:

Result CommitTransaction(CWallet& wallet, const uint256& txid, CMutableTransaction&& mtx, std::vector<bilingual_str>& errors, uint256& bumped_txid)
{
    LOCK(wallet.cs_wallet);
    if (!errors.empty()) {
        return Result::MISC_ERROR;
    }
    auto it = txid.IsNull() ? wallet.mapWallet.end() : wallet.mapWallet.find(txid);
    if (it == wallet.mapWallet.end()) {
        errors.push_back(Untranslated("Invalid or non-wallet transaction id"));
        return Result::MISC_ERROR;
    }
    const CWalletTx& oldWtx = it->second;

    // make sure the transaction still has no descendants and hasn't been mined in the meantime
    Result result = PreconditionChecks(wallet, oldWtx, /* require_mine=*/ false, errors);
    if (result != Result::OK) {
        return result;
    }

    // commit/broadcast the tx
    CTransactionRef tx = MakeTransactionRef(std::move(mtx));
    mapValue_t mapValue = oldWtx.mapValue;
    mapValue["replaces_txid"] = oldWtx.GetHash().ToString();

    wallet.CommitTransaction(tx, std::move(mapValue), oldWtx.vOrderForm);

    // mark the original tx as bumped
    bumped_txid = tx->GetHash();
    if (!wallet.MarkReplaced(oldWtx.GetHash(), bumped_txid)) {
        errors.push_back(Untranslated("Created new bumpfee transaction but could not mark the original transaction as replaced"));
    }
    return Result::OK;
}